

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O0

void __thiscall GLPortal::DrawPortalStencil(GLPortal *this)

{
  FFlatVertexBuffer *this_00;
  uint uVar1;
  GLWall *pGVar2;
  uint *puVar3;
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  GLPortal *this_local;
  
  uVar1 = TArray<unsigned_int,_unsigned_int>::Size(&this->mPrimIndices);
  if (uVar1 == 0) {
    uVar1 = TArray<GLWall,_GLWall>::Size(&this->lines);
    TArray<unsigned_int,_unsigned_int>::Resize(&this->mPrimIndices,uVar1 << 1);
    for (local_14 = 0; uVar1 = TArray<GLWall,_GLWall>::Size(&this->lines), local_14 < uVar1;
        local_14 = local_14 + 1) {
      if (gl.buffermethod != 1) {
        pGVar2 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)local_14);
        GLWall::MakeVertices(pGVar2,false);
      }
      pGVar2 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)local_14);
      uVar1 = pGVar2->vertindex;
      puVar3 = TArray<unsigned_int,_unsigned_int>::operator[]
                         (&this->mPrimIndices,(ulong)(local_14 << 1));
      *puVar3 = uVar1;
      pGVar2 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)local_14);
      uVar1 = pGVar2->vertcount;
      puVar3 = TArray<unsigned_int,_unsigned_int>::operator[]
                         (&this->mPrimIndices,(ulong)(local_14 * 2 + 1));
      *puVar3 = uVar1;
    }
  }
  FRenderState::Apply(&gl_RenderState);
  for (local_18 = 0; uVar1 = TArray<unsigned_int,_unsigned_int>::Size(&this->mPrimIndices),
      local_18 < uVar1; local_18 = local_18 + 2) {
    this_00 = GLRenderer->mVBO;
    puVar3 = TArray<unsigned_int,_unsigned_int>::operator[](&this->mPrimIndices,(ulong)local_18);
    uVar1 = *puVar3;
    puVar3 = TArray<unsigned_int,_unsigned_int>::operator[]
                       (&this->mPrimIndices,(ulong)(local_18 + 1));
    FFlatVertexBuffer::RenderArray(this_00,6,uVar1,*puVar3);
  }
  uVar1 = (*this->_vptr_GLPortal[5])();
  if (((uVar1 & 1) != 0) && (uVar1 = TArray<GLWall,_GLWall>::Size(&this->lines), 1 < uVar1)) {
    FFlatVertexBuffer::RenderArray(GLRenderer->mVBO,6,0xc,4);
    FFlatVertexBuffer::RenderArray(GLRenderer->mVBO,6,0x10,4);
  }
  return;
}

Assistant:

void GLPortal::DrawPortalStencil()
{
	if (mPrimIndices.Size() == 0)
	{
		mPrimIndices.Resize(2 * lines.Size());

		for (unsigned int i = 0; i < lines.Size(); i++)
		{
			if (gl.buffermethod != BM_DEFERRED) lines[i].MakeVertices(false);
			mPrimIndices[i * 2] = lines[i].vertindex;
			mPrimIndices[i * 2 + 1] = lines[i].vertcount;
		}
	}
	gl_RenderState.Apply();
	for (unsigned int i = 0; i < mPrimIndices.Size(); i += 2)
	{
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, mPrimIndices[i], mPrimIndices[i + 1]);
	}
	if (NeedCap() && lines.Size() > 1)
	{
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, FFlatVertexBuffer::STENCILTOP_INDEX, 4);
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, FFlatVertexBuffer::STENCILBOTTOM_INDEX, 4);
	}
}